

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O3

bool google::protobuf::compiler::annotation_test_util::AnnotationMatchesSubstring
               (string *file_content,Annotation *annotation,string *expected_text)

{
  bool bVar1;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  annotations;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  local_38;
  Annotation *local_18;
  
  local_38.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = annotation;
  std::
  vector<google::protobuf::GeneratedCodeInfo_Annotation_const*,std::allocator<google::protobuf::GeneratedCodeInfo_Annotation_const*>>
  ::_M_realloc_insert<google::protobuf::GeneratedCodeInfo_Annotation_const*const&>
            ((vector<google::protobuf::GeneratedCodeInfo_Annotation_const*,std::allocator<google::protobuf::GeneratedCodeInfo_Annotation_const*>>
              *)&local_38,(iterator)0x0,&local_18);
  bVar1 = AtLeastOneAnnotationMatchesSubstring
                    (file_content,&local_38,expected_text,
                     (optional<google::protobuf::GeneratedCodeInfo_Annotation_Semantic>)0x0);
  if (local_38.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool AnnotationMatchesSubstring(const std::string& file_content,
                                const GeneratedCodeInfo::Annotation* annotation,
                                const std::string& expected_text) {
  std::vector<const GeneratedCodeInfo::Annotation*> annotations;
  annotations.push_back(annotation);
  return AtLeastOneAnnotationMatchesSubstring(file_content, annotations,
                                              expected_text);
}